

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

hugeint_t __thiscall duckdb::Value::GetValueInternal<duckdb::hugeint_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  char input;
  byte input_00;
  uint16_t input_01;
  short input_02;
  uint uVar3;
  uint64_t uVar4;
  char *__s;
  TryCast *pTVar5;
  hugeint_t hVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  InvalidInputException *pIVar10;
  string *psVar11;
  size_t sVar12;
  NotImplementedException *pNVar13;
  InternalException *pIVar14;
  int64_t iVar15;
  uint64_t uVar16;
  undefined8 uVar17;
  char input_03;
  bool input_04;
  uchar input_05;
  duckdb *pdVar18;
  undefined1 in_R8B;
  undefined1 auVar19 [12];
  hugeint_t hVar20;
  undefined1 auVar21 [16];
  uhugeint_t input_06;
  string_t input_07;
  uhugeint_t input_08;
  string_t input_09;
  unkbyte10 Var22;
  hugeint_t result;
  LogicalType local_b0;
  Value local_98;
  double local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (this->is_null == true) {
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar14,(string *)&local_98);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    bVar8 = (this->value_).boolean;
    bVar9 = TryCast::Operation<bool,duckdb::hugeint_t>(bVar8,(hugeint_t *)&local_b0,false);
    if (!bVar9) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<bool,duckdb::hugeint_t>((string *)&local_98,(duckdb *)(ulong)bVar8,input_04)
      ;
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TINYINT:
    input = (this->value_).tinyint;
    bVar8 = TryCast::Operation<signed_char,duckdb::hugeint_t>(input,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input,input_03);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case SMALLINT:
    input_02 = (this->value_).smallint;
    bVar8 = TryCast::Operation<short,duckdb::hugeint_t>(input_02,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      Var22 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input_02,
                 (short)((unkuint10)Var22 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var22,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var22,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case INTEGER:
    uVar3 = (this->value_).integer;
    bVar8 = TryCast::Operation<int,duckdb::hugeint_t>(uVar3,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      auVar19 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)uVar3,auVar19._8_4_);
      InvalidInputException::InvalidInputException(auVar19._0_8_,(string *)&local_98);
      __cxa_throw(auVar19._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case BIGINT:
    pdVar18 = (duckdb *)(this->value_).bigint;
    bVar8 = TryCast::Operation<long,duckdb::hugeint_t>
                      ((int64_t)pdVar18,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      auVar21 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,duckdb::hugeint_t>((string *)&local_98,pdVar18,auVar21._8_8_);
      InvalidInputException::InvalidInputException(auVar21._0_8_,(string *)&local_98);
      __cxa_throw(auVar21._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case DATE:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT32,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_MS:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_NS:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_b0,DOUBLE);
    DefaultCastAs(&local_98,this,&local_b0,false);
    hVar20 = GetValueInternal<duckdb::hugeint_t>(&local_98);
    ~Value(&local_98);
    LogicalType::~LogicalType(&local_b0);
    auVar21._0_8_ = hVar20.lower;
    auVar21._8_8_ = hVar20.upper;
    return (hugeint_t)auVar21;
  case FLOAT:
    local_58 = (double)CONCAT44(local_58._4_4_,(this->value_).float_);
    pdVar18 = (duckdb *)0x0;
    bVar8 = TryCast::Operation<float,duckdb::hugeint_t>
                      ((this->value_).float_,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,duckdb::hugeint_t>((string *)&local_98,pdVar18,local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case DOUBLE:
    local_58 = (this->value_).double_;
    pdVar18 = (duckdb *)0x0;
    bVar8 = TryCast::Operation<double,duckdb::hugeint_t>(local_58,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,duckdb::hugeint_t>((string *)&local_98,pdVar18,local_58);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case VARCHAR:
    psVar11 = StringValue::Get_abi_cxx11_(this);
    __s = (psVar11->_M_dataplus)._M_p;
    sVar12 = strlen(__s);
    local_50 = (uint)sVar12;
    if (local_50 < 0xd) {
      uStack_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (local_50 != 0) {
        switchD_012dd528::default(&uStack_4c,__s,(ulong)(local_50 & 0xf));
      }
    }
    else {
      uStack_4c = *(undefined4 *)__s;
      uStack_48 = SUB84(__s,0);
      uStack_44 = (undefined4)((ulong)__s >> 0x20);
    }
    pTVar5 = (TryCast *)CONCAT44(uStack_4c,local_50);
    uVar7 = CONCAT44(uStack_44,uStack_48);
    uVar17 = 0;
    input_09.value.pointer.ptr = (char *)&local_b0;
    input_09.value._0_8_ = uVar7;
    bVar8 = TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
                      (pTVar5,input_09,(hugeint_t *)0x0,(bool)in_R8B);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_07.value.pointer.ptr = (char *)uVar17;
      input_07.value._0_8_ = uVar7;
      CastExceptionText<duckdb::string_t,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)pTVar5,input_07);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case INTERVAL:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INTERVAL,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    input_00 = (this->value_).utinyint;
    bVar8 = TryCast::Operation<unsigned_char,duckdb::hugeint_t>
                      (input_00,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_char,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)input_00,input_05);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case USMALLINT:
    input_01 = (this->value_).usmallint;
    bVar8 = TryCast::Operation<unsigned_short,duckdb::hugeint_t>
                      (input_01,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      Var22 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_short,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)input_01,
                 (unsigned_short)((unkuint10)Var22 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var22,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var22,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UINTEGER:
    uVar3 = (this->value_).uinteger;
    bVar8 = TryCast::Operation<unsigned_int,duckdb::hugeint_t>(uVar3,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      auVar19 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_int,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)(ulong)uVar3,auVar19._8_4_);
      InvalidInputException::InvalidInputException(auVar19._0_8_,(string *)&local_98);
      __cxa_throw(auVar19._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UBIGINT:
    pdVar18 = (duckdb *)(this->value_).ubigint;
    bVar8 = TryCast::Operation<unsigned_long,duckdb::hugeint_t>
                      ((uint64_t)pdVar18,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      auVar21 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_long,duckdb::hugeint_t>((string *)&local_98,pdVar18,auVar21._8_8_);
      InvalidInputException::InvalidInputException(auVar21._0_8_,(string *)&local_98);
      __cxa_throw(auVar21._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_TZ:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INT64,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar13,(string *)&local_98,INVALID,INT128);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pTVar5 = *(TryCast **)&this->value_;
    uVar4 = (this->value_).hugeint.upper;
    uVar16 = 0;
    input_08.upper = (uint64_t)&local_b0;
    input_08.lower = uVar4;
    bVar8 = TryCast::Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                      (pTVar5,input_08,(hugeint_t *)0x0,(bool)in_R8B);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_06.upper = uVar16;
      input_06.lower = uVar4;
      CastExceptionText<duckdb::uhugeint_t,duckdb::hugeint_t>
                ((string *)&local_98,(duckdb *)pTVar5,input_06);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case HUGEINT:
  case UUID:
    pdVar18 = (duckdb *)(this->value_).hugeint.lower;
    uVar4 = (this->value_).hugeint.upper;
    iVar15 = 0;
    bVar8 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                      ((this->value_).hugeint,(hugeint_t *)&local_b0,false);
    if (!bVar8) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      hVar20.upper = iVar15;
      hVar20.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>((string *)&local_98,pdVar18,hVar20);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) {
        hVar20 = Cast::Operation<unsigned_int,duckdb::hugeint_t>((this->value_).uinteger);
        return hVar20;
      }
      if (PVar2 != UINT16) {
        if (PVar2 == UINT8) {
          hVar20 = Cast::Operation<unsigned_char,duckdb::hugeint_t>((this->value_).utinyint);
          return hVar20;
        }
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98.type_._0_8_ =
             &local_98.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid Internal Type for ENUMs","");
        InternalException::InternalException(pIVar14,(string *)&local_98);
        __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      hVar20 = Cast::Operation<unsigned_short,duckdb::hugeint_t>((this->value_).usmallint);
      return hVar20;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar13,(string *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  hVar6.upper = (int64_t)local_b0.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
  hVar6.lower._0_1_ = local_b0.id_;
  hVar6.lower._1_1_ = local_b0.physical_type_;
  hVar6.lower._2_6_ = local_b0._2_6_;
  return hVar6;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}